

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_zip_close(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  SyArchive *pArch;
  jx9_vfs *pVfs;
  zip_raw_data *pRaw;
  SyArchive *pArchive;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 1) || (iVar1 = jx9_value_is_resource(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pCtx,1,"Expecting a ZIP archive");
  }
  else {
    pArch = (SyArchive *)jx9_value_to_resource(*apArg);
    if ((pArch == (SyArchive *)0x0) || (pArch->nMagic != 0xdead635a)) {
      jx9_context_throw_error(pCtx,1,"Expecting a ZIP archive");
    }
    else {
      SyArchiveRelease(pArch);
      if (*(int *)&pArch[1].pAllocator == 2) {
        SyBlobRelease((SyBlob *)&pArch[1].pCursor);
      }
      else if (pArch[1].apHash[0x22] != (SyArchiveEntry *)0x0) {
        (*(code *)pArch[1].apHash[0x22])(pArch[1].pCursor,pArch[1].pList);
      }
      jx9_context_free_chunk(pCtx,pArch);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_zip_close(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyArchive *pArchive;
	zip_raw_data *pRaw;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive");
		return JX9_OK;
	}
	/* Point to the in-memory archive */
	pArchive = (SyArchive *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid ZIP archive */
	if( SXARCH_INVALID(pArchive) ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive");
		return JX9_OK;
	}
	/* Release the archive */
	SyArchiveRelease(pArchive);
	pRaw = (zip_raw_data *)&pArchive[1];
	if( pRaw->iType == ZIP_RAW_DATA_MEMBUF ){
		SyBlobRelease(&pRaw->raw.sBlob);
	}else{
		const jx9_vfs *pVfs = pRaw->raw.mmap.pVfs;
		if( pVfs->xUnmap ){
			/* Unmap the memory view */
			pVfs->xUnmap(pRaw->raw.mmap.pMap, pRaw->raw.mmap.nSize);
		}
	}
	/* Release the memory chunk */
	jx9_context_free_chunk(pCtx, pArchive);
	return JX9_OK;
}